

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
hufDecode(uint64_t *hcode,HufDec *hdecod,uint8_t *in,uint64_t ni,uint32_t rlc,uint64_t no,
         uint16_t *out)

{
  uint16_t uVar1;
  uint32_t *puVar2;
  uint16_t *puVar3;
  uint uVar4;
  uint16_t *puVar5;
  byte *pbVar6;
  HufDec *pHVar7;
  ulong uVar8;
  byte local_a1;
  byte local_8d;
  uint local_80;
  byte local_79;
  uint16_t s_2;
  uint8_t cs_2;
  HufDec *pl_1;
  uint64_t decoffset_1;
  uint16_t s_1;
  uint8_t cs_1;
  int l;
  uint32_t *decbuf;
  uint32_t j;
  uint16_t s;
  uint8_t cs;
  HufDec *pl;
  uint64_t decoffset;
  uint8_t *ie;
  uint16_t *oe;
  uint16_t *outb;
  byte *pbStack_20;
  int lc;
  uint64_t c;
  uint64_t i;
  uint64_t no_local;
  
  puVar3 = out;
  pl = (HufDec *)0x0;
  _s = 0;
  puVar5 = out + no;
  pbVar6 = in + (ni + 7 >> 3);
  pbStack_20 = in;
  do {
    if (pbVar6 <= pbStack_20) {
      uVar8 = 8 - ni & 7;
      pl = (HufDec *)((ulong)pl >> (sbyte)uVar8);
      _s = _s - (int)uVar8;
      while( true ) {
        while( true ) {
          if (_s < 1) {
            no_local._4_4_ = (uint)(out != puVar5);
            return no_local._4_4_;
          }
          pHVar7 = hdecod + ((long)pl << (0xeU - (char)_s & 0x3f) & 0x3fff);
          if (pHVar7->len == 0) {
            return 0x17;
          }
          if (_s < pHVar7->len) {
            return 0x17;
          }
          _s = _s - pHVar7->len;
          if (pHVar7->lit == rlc) break;
          if (puVar5 <= out) {
            return 0x17;
          }
          *out = (uint16_t)pHVar7->lit;
          out = out + 1;
        }
        if (_s < 8) {
          if (pbVar6 <= pbStack_20) {
            return 1;
          }
          pl = (HufDec *)((long)pl << 8 | (ulong)*pbStack_20);
          _s = _s + 8;
          pbStack_20 = pbStack_20 + 1;
        }
        _s = _s + -8;
        local_a1 = (byte)((ulong)pl >> ((byte)_s & 0x3f));
        if (puVar5 < out + (int)(uint)local_a1) break;
        if (out + -1 < puVar3) {
          return 1;
        }
        uVar1 = out[-1];
        while (local_a1 != 0) {
          *out = uVar1;
          out = out + 1;
          local_a1 = local_a1 - 1;
        }
      }
      return 0x17;
    }
    pl = (HufDec *)((long)pl << 8 | (ulong)*pbStack_20);
    _s = _s + 8;
    pbStack_20 = pbStack_20 + 1;
    while (0xd < _s) {
      pHVar7 = hdecod + ((ulong)pl >> ((char)_s - 0xeU & 0x3f) & 0x3fff);
      if (pHVar7->len == 0) {
        puVar2 = pHVar7->p;
        if (pHVar7->p == (uint32_t *)0x0) {
          return 0x17;
        }
        for (local_80 = 0; local_80 < pHVar7->lit; local_80 = local_80 + 1) {
          uVar4 = (uint)hcode[puVar2[local_80]] & 0x3f;
          for (; _s < (int)uVar4 && pbStack_20 < pbVar6; _s = _s + 8) {
            pl = (HufDec *)((long)pl << 8 | (ulong)*pbStack_20);
            pbStack_20 = pbStack_20 + 1;
          }
          if (((int)uVar4 <= _s) &&
             (hcode[puVar2[local_80]] >> 6 ==
              ((ulong)pl >> ((char)_s - (sbyte)uVar4 & 0x3fU) & (1L << (sbyte)uVar4) - 1U))) {
            _s = _s - uVar4;
            if (puVar2[local_80] == rlc) {
              if (_s < 8) {
                if (pbVar6 <= pbStack_20) {
                  return 1;
                }
                pl = (HufDec *)((long)pl << 8 | (ulong)*pbStack_20);
                _s = _s + 8;
                pbStack_20 = pbStack_20 + 1;
              }
              _s = _s + -8;
              local_8d = (byte)((ulong)pl >> ((byte)_s & 0x3f));
              if (puVar5 < out + (int)(uint)local_8d) {
                return 0x17;
              }
              if (out + -1 < puVar3) {
                return 1;
              }
              uVar1 = out[-1];
              while (local_8d != 0) {
                *out = uVar1;
                out = out + 1;
                local_8d = local_8d - 1;
              }
            }
            else {
              if (puVar5 <= out) {
                return 0x17;
              }
              *out = (uint16_t)puVar2[local_80];
              out = out + 1;
            }
            break;
          }
        }
        if (local_80 == pHVar7->lit) {
          return 0x17;
        }
      }
      else {
        if (_s < pHVar7->len) {
          return 0x17;
        }
        _s = _s - pHVar7->len;
        if (pHVar7->lit == rlc) {
          if (_s < 8) {
            if (pbVar6 <= pbStack_20) {
              return 1;
            }
            pl = (HufDec *)((long)pl << 8 | (ulong)*pbStack_20);
            _s = _s + 8;
            pbStack_20 = pbStack_20 + 1;
          }
          _s = _s + -8;
          local_79 = (byte)((ulong)pl >> ((byte)_s & 0x3f));
          if (puVar5 < out + (int)(uint)local_79) {
            return 0x17;
          }
          if (out + -1 < puVar3) {
            return 1;
          }
          uVar1 = out[-1];
          while (local_79 != 0) {
            *out = uVar1;
            out = out + 1;
            local_79 = local_79 - 1;
          }
        }
        else {
          if (puVar5 <= out) {
            return 0x17;
          }
          *out = (uint16_t)pHVar7->lit;
          out = out + 1;
        }
      }
    }
  } while( true );
}

Assistant:

static exr_result_t
hufDecode (
    const uint64_t* hcode,  // i : encoding table
    const HufDec*   hdecod, // i : decoding table
    const uint8_t*  in,     // i : compressed input buffer
    uint64_t        ni,     // i : input size (in bits)
    uint32_t        rlc,    // i : run-length code
    uint64_t        no,     // i : expected output size (count of uint16 items)
    uint16_t*       out)
{
    uint64_t       i;
    uint64_t       c    = 0;
    int            lc   = 0;
    uint16_t*      outb = out;
    uint16_t*      oe   = out + no;
    const uint8_t* ie   = in + (ni + 7) / 8; // input byte size

    //
    // Loop on input bytes
    //

    while (in < ie)
    {
        getChar (c, lc, in);

        //
        // Access decoding table
        //

        while (lc >= HUF_DECBITS)
        {
            uint64_t      decoffset = (c >> (lc - HUF_DECBITS)) & HUF_DECMASK;
            const HufDec* pl        = hdecod + decoffset;

            if (pl->len)
            {
                //
                // Get short code
                //

                if (pl->len > lc) return EXR_ERR_CORRUPT_CHUNK;

                lc -= pl->len;
                getCode (pl->lit, rlc, c, lc, in, ie, out, outb, oe);
            }
            else
            {
                uint32_t        j;
                const uint32_t* decbuf = pl->p;
                if (!pl->p) return EXR_ERR_CORRUPT_CHUNK; // wrong code

                //
                // Search long code
                //

                for (j = 0; j < pl->lit; j++)
                {
                    int l = hufLength (hcode[decbuf[j]]);

                    while (lc < l && in < ie) // get more bits
                    {
                        getChar (c, lc, in);
                    }

                    if (lc >= l)
                    {
                        if (hufCode (hcode[decbuf[j]]) ==
                            ((c >> (lc - l)) & (((uint64_t) (1) << l) - 1)))
                        {
                            //
                            // Found : get long code
                            //

                            lc -= l;
                            getCode (
                                decbuf[j], rlc, c, lc, in, ie, out, outb, oe);
                            break;
                        }
                    }
                }

                if (j == pl->lit) return EXR_ERR_CORRUPT_CHUNK;
            }
        }
    }

    //
    // Get remaining (short) codes
    //

    i = (8 - ni) & 7;
    c >>= i;
    lc -= (int) i;

    while (lc > 0)
    {
        uint64_t      decoffset = (c << (HUF_DECBITS - lc)) & HUF_DECMASK;
        const HufDec* pl        = hdecod + decoffset;

        if (pl->len)
        {
            if (pl->len > lc) return EXR_ERR_CORRUPT_CHUNK;
            lc -= pl->len;
            getCode (pl->lit, rlc, c, lc, in, ie, out, outb, oe);
        }
        else
            return EXR_ERR_CORRUPT_CHUNK;
    }

    if (out != oe) return EXR_ERR_OUT_OF_MEMORY;
    return EXR_ERR_SUCCESS;
}